

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

int __thiscall FLineIdIterator::Next(FLineIdIterator *this)

{
  FTagItem *pFVar1;
  bool bVar2;
  int ret;
  FLineIdIterator *this_local;
  
  while( true ) {
    bVar2 = false;
    if (-1 < this->start) {
      pFVar1 = TArray<FTagItem,_FTagItem>::operator[](&tagManager.allIDs,(long)this->start);
      bVar2 = pFVar1->tag != this->searchtag;
    }
    if (!bVar2) break;
    pFVar1 = TArray<FTagItem,_FTagItem>::operator[](&tagManager.allIDs,(long)this->start);
    this->start = pFVar1->nexttag;
  }
  if (this->start == -1) {
    this_local._4_4_ = -1;
  }
  else {
    pFVar1 = TArray<FTagItem,_FTagItem>::operator[](&tagManager.allIDs,(long)this->start);
    this_local._4_4_ = pFVar1->target;
    pFVar1 = TArray<FTagItem,_FTagItem>::operator[](&tagManager.allIDs,(long)this->start);
    this->start = pFVar1->nexttag;
  }
  return this_local._4_4_;
}

Assistant:

int FLineIdIterator::Next()
{
	while (start >= 0 && tagManager.allIDs[start].tag != searchtag) start = tagManager.allIDs[start].nexttag;
	if (start == -1) return -1;
	int ret = tagManager.allIDs[start].target;
	start = tagManager.allIDs[start].nexttag;
	return ret;
}